

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O2

void gmath::div<double>(Polynomial<double> *p,Polynomial<double> *d,Polynomial<double> *q,
                       Polynomial<double> *r)

{
  int i;
  int i_00;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int local_54;
  long local_50;
  ulong local_48;
  
  q->used = 1;
  *q->c = 0.0;
  Polynomial<double>::operator=(r,p);
  local_54 = p->used - d->used;
  iVar3 = ~d->used + p->used;
  uVar2 = (ulong)local_54;
  local_54 = local_54 + -2;
  local_48 = ~uVar2;
  local_50 = local_48 * 8;
  while( true ) {
    uVar1 = (long)d->used - 1;
    if ((long)uVar2 < 0) break;
    dVar5 = 0.0;
    if ((long)(uVar1 + uVar2) < (long)r->used) {
      dVar5 = r->c[uVar1 + uVar2];
    }
    Polynomial<double>::set(q,(int)uVar2,dVar5 / d->c[(long)d->used + -1]);
    i_00 = d->used + local_54;
    for (lVar4 = (long)(iVar3 + d->used); (long)uVar2 < lVar4; lVar4 = lVar4 + -1) {
      dVar6 = 0.0;
      dVar5 = 0.0;
      if (lVar4 <= r->used) {
        dVar5 = r->c[lVar4 + -1];
      }
      if ((long)uVar2 < (long)q->used) {
        dVar6 = q->c[uVar2];
      }
      dVar7 = 0.0;
      if ((long)(local_48 + lVar4) < (long)d->used) {
        dVar7 = *(double *)((long)d->c + lVar4 * 8 + local_50);
      }
      Polynomial<double>::set(r,i_00,dVar5 - dVar6 * dVar7);
      i_00 = i_00 + -1;
    }
    uVar2 = uVar2 - 1;
    iVar3 = iVar3 + -1;
    local_54 = local_54 + -1;
    local_50 = local_50 + 8;
    local_48 = local_48 + 1;
  }
  while (iVar3 = (int)uVar1, iVar3 < p->used) {
    Polynomial<double>::set(r,iVar3,0.0);
    uVar1 = (ulong)(iVar3 + 1);
  }
  return;
}

Assistant:

void div(const Polynomial<T> &p, const Polynomial<T> &d,
                           Polynomial<T> &q, Polynomial<T> &r)
{
  // initialisation

  q.init();
  r=p;

  // perform division

  for (int k=p.getDegree()-d.getDegree(); k>=0; k--)
  {
    q.set(k, r[d.getDegree()+k]/d[d.getDegree()]);

    for (int i=d.getDegree()+k-1; i>=k; i--)
    {
      r.set(i, r[i]-q[k]*d[i-k]);
    }
  }

  // set leading coefficients of working array zero

  for (int i=d.getDegree(); i<p.getDegree()+1; i++)
  {
    r.set(i, 0);
  }
}